

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O1

void __thiscall Potassco::SmodelsConvert::flushMinimize(SmodelsConvert *this)

{
  _Rb_tree_color _Var1;
  AbstractProgram *pAVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  Span<Potassco::WeightLit_t> local_50;
  Span<Potassco::WeightLit_t> local_40;
  
  p_Var3 = (this->data_->minimize_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->data_->minimize_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var4) {
    do {
      pAVar2 = this->out_;
      _Var1 = p_Var3[1]._M_color;
      local_50.first = (WeightLit_t *)p_Var3[1]._M_parent;
      local_50.size = (size_t)((long)p_Var3[1]._M_left - (long)local_50.first >> 3);
      if (p_Var3[1]._M_left == (_Base_ptr)local_50.first) {
        local_50.size = (size_t)(_Base_ptr)0x0;
        local_50.first = (WeightLit_t *)(_Base_ptr)0x0;
      }
      local_40 = SmData::mapLits<Potassco::WeightLit_t>(this->data_,&local_50,&this->data_->wlits_);
      (*pAVar2->_vptr_AbstractProgram[6])(pAVar2,(ulong)_Var1,&local_40);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var4);
  }
  return;
}

Assistant:

void SmodelsConvert::flushMinimize() {
	for (SmData::MinMap::iterator it = data_->minimize_.begin(), end = data_->minimize_.end(); it != end; ++it) {
		out_.minimize(it->first, data_->mapLits(toSpan(it->second), data_->wlits_));
	}
}